

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O1

idx_t __thiscall
duckdb::ExpressionExecutor::Select
          (ExpressionExecutor *this,BoundComparisonExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,SelectionVector *true_sel,SelectionVector *false_sel)

{
  DataChunk *this_00;
  reference result;
  reference result_00;
  type pEVar1;
  reference pvVar2;
  idx_t iVar3;
  InternalException *this_01;
  reference pvVar4;
  string local_50;
  
  this_00 = &state->intermediate_chunk;
  DataChunk::Reset(this_00);
  result = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
  result_00 = vector<duckdb::Vector,_true>::operator[](&this_00->data,1);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->left);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](&state->child_states,0);
  Execute(this,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,result);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->right);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](&state->child_states,1);
  Execute(this,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,result_00)
  ;
  switch((expr->super_Expression).super_BaseExpression.type) {
  case COMPARE_BOUNDARY_START:
    iVar3 = VectorOperations::Equals
                      (result,result_00,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count
                       ,(optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    return iVar3;
  case COMPARE_NOTEQUAL:
    iVar3 = VectorOperations::NotEquals
                      (result,result_00,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count
                       ,(optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    return iVar3;
  case COMPARE_LESSTHAN:
    pvVar4 = result;
    break;
  case COMPARE_GREATERTHAN:
    pvVar4 = result_00;
    result_00 = result;
    break;
  case COMPARE_LESSTHANOREQUALTO:
    pvVar4 = result;
    goto LAB_0144932f;
  case COMPARE_GREATERTHANOREQUALTO:
    pvVar4 = result_00;
    result_00 = result;
LAB_0144932f:
    iVar3 = TemplatedSelectOperation<duckdb::GreaterThanEquals>
                      (result_00,pvVar4,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count
                       ,(optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    return iVar3;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unknown comparison type!","");
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case COMPARE_DISTINCT_FROM:
    iVar3 = VectorOperations::DistinctFrom
                      (result,result_00,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count
                       ,(optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel);
    return iVar3;
  case COMPARE_BOUNDARY_END:
    iVar3 = VectorOperations::NotDistinctFrom
                      (result,result_00,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count
                       ,(optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel);
    return iVar3;
  }
  iVar3 = TemplatedSelectOperation<duckdb::GreaterThan>
                    (result_00,pvVar4,(optional_ptr<const_duckdb::SelectionVector,_true>)sel,count,
                     (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                     (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                     (optional_ptr<duckdb::ValidityMask,_true>)0x0);
  return iVar3;
}

Assistant:

idx_t ExpressionExecutor::Select(const BoundComparisonExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
                                 SelectionVector *false_sel) {
	// resolve the children
	state->intermediate_chunk.Reset();
	auto &left = state->intermediate_chunk.data[0];
	auto &right = state->intermediate_chunk.data[1];

	Execute(*expr.left, state->child_states[0].get(), sel, count, left);
	Execute(*expr.right, state->child_states[1].get(), sel, count, right);

	switch (expr.GetExpressionType()) {
	case ExpressionType::COMPARE_EQUAL:
		return VectorOperations::Equals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_NOTEQUAL:
		return VectorOperations::NotEquals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_LESSTHAN:
		return VectorOperations::LessThan(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_GREATERTHAN:
		return VectorOperations::GreaterThan(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return VectorOperations::LessThanEquals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return VectorOperations::GreaterThanEquals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return VectorOperations::DistinctFrom(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		return VectorOperations::NotDistinctFrom(left, right, sel, count, true_sel, false_sel);
	default:
		throw InternalException("Unknown comparison type!");
	}
}